

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

void CompareOnTheFlyMaterial(comparer_context *comp)

{
  EVP_PKEY_CTX *ctx;
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  undefined1 local_48 [32];
  long local_28;
  comparer_context *local_20;
  
  comparer_context::push_elem(comp,"aiMaterial");
  local_48._0_8_ = local_48 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"aiMaterial::mNumProperties","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_48);
  if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
    operator_delete((void *)local_48._0_8_,CONCAT71(local_48._17_7_,local_48[0x10]) + 1);
  }
  ctx = (EVP_PKEY_CTX *)&local_20;
  local_20 = comp;
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_48,(sliced_chunk_reader *)ctx);
  while (local_48[0x10] != '\x01') {
    if (local_48._8_4_ == 0x123e) {
      CompareOnTheFlyMaterialProperty(comp);
    }
    sliced_chunk_iterator::cleanup((sliced_chunk_iterator *)local_48,ctx);
    sliced_chunk_iterator::load_next((sliced_chunk_iterator *)local_48);
  }
  fseek(*(FILE **)local_48._0_8_,local_28,0);
  fseek(*(FILE **)(local_48._0_8_ + 8),local_28,0);
  comparer_context::pop_elem(comp);
  return;
}

Assistant:

void CompareOnTheFlyMaterial(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiMaterial");

    comp.cmp<uint32_t>("aiMaterial::mNumProperties");
    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AIMATERIALPROPERTY) {
            CompareOnTheFlyMaterialProperty(comp);
        }
    }
}